

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tcuTexture.cpp
# Opt level: O0

void __thiscall
tcu::Texture2DArray::Texture2DArray
          (Texture2DArray *this,TextureFormat *format,int width,int height,int numLayers)

{
  int iVar1;
  ConstPixelBufferAccess *levels;
  int numLayers_local;
  int height_local;
  int width_local;
  TextureFormat *format_local;
  Texture2DArray *this_local;
  
  iVar1 = computeMipPyramidLevels(width,height);
  TextureLevelPyramid::TextureLevelPyramid(&this->super_TextureLevelPyramid,format,iVar1);
  this->m_width = width;
  this->m_height = height;
  this->m_numLayers = numLayers;
  iVar1 = TextureLevelPyramid::getNumLevels(&this->super_TextureLevelPyramid);
  levels = &TextureLevelPyramid::getLevels(&this->super_TextureLevelPyramid)->
            super_ConstPixelBufferAccess;
  Texture2DArrayView::Texture2DArrayView(&this->m_view,iVar1,levels);
  return;
}

Assistant:

Texture2DArray::Texture2DArray (const TextureFormat& format, int width, int height, int numLayers)
	: TextureLevelPyramid	(format, computeMipPyramidLevels(width, height))
	, m_width				(width)
	, m_height				(height)
	, m_numLayers			(numLayers)
	, m_view				(getNumLevels(), getLevels())
{
}